

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

void mipsdsp_rndrashift_short_acc(int64_t *p,int32_t ac,int32_t shift,CPUMIPSState_conflict5 *env)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (env->active_tc).HI[ac] << 0x20;
  uVar1 = (uint)(env->active_tc).LO[ac] | uVar3;
  lVar2 = (long)uVar1 >> ((char)shift - 1U & 0x3f);
  if (shift == 0) {
    lVar2 = uVar1 * 2;
  }
  *p = lVar2;
  p[1] = uVar3 >> 0x3f;
  return;
}

Assistant:

static inline void mipsdsp_rndrashift_short_acc(int64_t *p,
                                                int32_t ac,
                                                int32_t shift,
                                                CPUMIPSState *env)
{
    int64_t acc;

    acc = ((int64_t)env->active_tc.HI[ac] << 32) |
          ((int64_t)env->active_tc.LO[ac] & 0xFFFFFFFF);
    p[0] = (shift == 0) ? (acc << 1) : (acc >> (shift - 1));
    p[1] = (acc >> 63) & 0x01;
}